

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Read<double> __thiscall
Omega_h::graph_reduce<double>(Omega_h *this,Graph *a2b,Read<double> *b_data,Int width,Omega_h_Op op)

{
  void *extraout_RDX;
  Read<double> RVar1;
  Read<double> local_b8;
  Read<int> local_a8;
  Read<double> local_98;
  Read<int> local_88;
  Write<signed_char> local_78;
  undefined1 local_68 [8];
  Read<double> ab_data;
  undefined1 local_48 [8];
  LOs ab2b;
  LOs a2ab;
  Omega_h_Op op_local;
  Int width_local;
  Read<double> *b_data_local;
  Graph *a2b_local;
  
  Read<int>::Read((Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr,&a2b->a2ab);
  Read<int>::Read((Read<int> *)local_48,&a2b->ab2b);
  Read<int>::Read(&local_88,(Read<int> *)local_48);
  Read<double>::Read(&local_98,b_data);
  unmap<double>((Omega_h *)&local_78,&local_88,(Read<signed_char> *)&local_98,width);
  read<double>((Omega_h *)local_68,&local_78);
  Write<double>::~Write((Write<double> *)&local_78);
  Read<double>::~Read(&local_98);
  Read<int>::~Read(&local_88);
  Read<int>::Read(&local_a8,(Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_b8,(Read<double> *)local_68);
  fan_reduce<double>(this,&local_a8,(Read<signed_char> *)&local_b8,width,op);
  Read<double>::~Read(&local_b8);
  Read<int>::~Read(&local_a8);
  Read<double>::~Read((Read<double> *)local_68);
  Read<int>::~Read((Read<int> *)local_48);
  Read<int>::~Read((Read<int> *)&ab2b.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> graph_reduce(Graph a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  auto a2ab = a2b.a2ab;
  auto ab2b = a2b.ab2b;
  auto ab_data = read(unmap(ab2b, b_data, width));
  return fan_reduce(a2ab, ab_data, width, op);
}